

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_hailstorm(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  CHAR_DATA *ach;
  ulong uVar6;
  char buf [4608];
  
  uVar4 = dice(level,4);
  bVar3 = is_outside(ch);
  uVar2 = (int)((float)(int)uVar4 * 1.75);
  if (!bVar3) {
    uVar2 = uVar4;
  }
  uVar6 = (ulong)uVar2;
  act("You conjure a rain of deadly hailstones to pelt the area!",ch,(void *)0x0,(void *)0x0,3);
  act("$n throws $s arms in the air, calling a rain of deadly hailstones upon the area!",ch,
      (void *)0x0,(void *)0x0,0);
  pCVar1 = ch->in_room->people;
  while (ach = pCVar1, ach != (CHAR_DATA *)0x0) {
    pCVar1 = ach->next_in_room;
    bVar3 = is_same_group(ach,ch);
    if (!bVar3) {
      bVar3 = is_safe(ch,ach);
      if (!bVar3) {
        bVar3 = is_same_cabal(ch,ach);
        if (!bVar3) {
          bVar3 = is_npc(ch);
          if (!bVar3) {
            bVar3 = is_npc(ach);
            if ((!bVar3) &&
               ((ch->fighting == (CHAR_DATA *)0x0 || (ach->fighting == (CHAR_DATA *)0x0)))) {
              pcVar5 = pers(ch,ach);
              snprintf(buf,0x1200,"Die, %s you sorcerous dog!",pcVar5);
              do_myell(ach,buf,ch);
            }
          }
          bVar3 = saves_spell(level,ach,5);
          if (bVar3) {
            uVar6 = (long)(int)uVar6 / 2 & 0xffffffff;
          }
          damage_new(ch,ach,(int)uVar6,-1,5,true,false,0,1,"hailstorm");
        }
      }
    }
  }
  return;
}

Assistant:

void spell_hailstorm(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char buf[MSL];
	CHAR_DATA *vch, *vch_next;
	int dam;

	dam = dice(level, 4);

	if (is_outside(ch))
		dam = (int)((float)dam * 1.75);

	act("You conjure a rain of deadly hailstones to pelt the area!", ch, 0, 0, TO_CHAR);
	act("$n throws $s arms in the air, calling a rain of deadly hailstones upon the area!", ch, 0, 0, TO_ROOM);

	for (vch = ch->in_room->people; vch; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_same_group(vch, ch) || is_safe(ch, vch) || is_same_cabal(ch, vch))
			continue;

		if (!is_npc(ch) && !is_npc(vch) && (!ch->fighting || !vch->fighting))
		{
			std::snprintf(buf, static_cast<size_t>(MSL), "Die, %s you sorcerous dog!", pers(ch, vch));
			do_myell(vch, buf, ch);
		}

		if (saves_spell(level, vch, DAM_COLD))
			dam /= 2;

		damage_new(ch, vch, dam, TYPE_UNDEFINED, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "hailstorm");
	}
}